

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WebAssemblyEnvironment.cpp
# Opt level: O0

void __thiscall
Js::WebAssemblyEnvironment::SetGlobalInternal<float>
          (WebAssemblyEnvironment *this,uint32 offset,float val)

{
  code *pcVar1;
  bool bVar2;
  WriteBarrierPtr<void> **ppWVar3;
  float **ppfVar4;
  undefined4 *puVar5;
  float *local_20;
  Type *ptr;
  float val_local;
  uint32 offset_local;
  WebAssemblyEnvironment *this_local;
  
  ptr._0_4_ = val;
  ptr._4_4_ = offset;
  _val_local = this;
  ppWVar3 = Memory::PointerValue<Memory::WriteBarrierPtr<void>>(&this->start);
  local_20 = (float *)((long)&(*ppWVar3)->ptr + (ulong)ptr._4_4_ * 4);
  ppfVar4 = Memory::PointerValue<float>(&local_20);
  CheckPtrIsValid<float>(this,(intptr_t)*ppfVar4);
  if ((*local_20 != 0.0) || (NAN(*local_20))) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/WebAssemblyEnvironment.cpp"
                                ,0x93,"(*ptr == 0)",
                                "We shouldn\'t overwrite anything on the environment once it is set"
                               );
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  *local_20 = ptr._0_4_;
  return;
}

Assistant:

void WebAssemblyEnvironment::SetGlobalInternal(uint32 offset, T val)
{
    Field(T)* ptr = (Field(T)*)PointerValue(start) + offset;
    CheckPtrIsValid<T>((intptr_t)PointerValue(ptr));
    AssertMsg(*ptr == 0, "We shouldn't overwrite anything on the environment once it is set");
    *ptr = val;
}